

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

uint aom_mse8x8_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  aom_variance8x8_sse2(src,src_stride,ref,ref_stride,sse);
  return *sse;
}

Assistant:

unsigned int aom_mse8x8_sse2(const uint8_t *src, int src_stride,
                             const uint8_t *ref, int ref_stride,
                             unsigned int *sse) {
  aom_variance8x8_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}